

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

IntrusiveList<SynFunctionArgument> ParseFunctionArguments(ParseContext *ctx)

{
  IntrusiveList<SynFunctionArgument> IVar1;
  bool bVar2;
  SynFunctionArgument *pSVar3;
  Lexeme *pos;
  SynFunctionArgument *argument;
  ParseContext *ctx_local;
  IntrusiveList<SynFunctionArgument> arguments;
  
  IntrusiveList<SynFunctionArgument>::IntrusiveList
            ((IntrusiveList<SynFunctionArgument> *)&ctx_local);
  pSVar3 = ParseFunctionArgument(ctx,false,(SynBase *)0x0);
  if (pSVar3 != (SynFunctionArgument *)0x0) {
    IntrusiveList<SynFunctionArgument>::push_back
              ((IntrusiveList<SynFunctionArgument> *)&ctx_local,pSVar3);
    while (bVar2 = ParseContext::Consume(ctx,lex_comma), bVar2) {
      pSVar3 = ParseFunctionArgument
                         (ctx,(bool)(((arguments.head)->super_SynBase).field_0x3a & 1),
                          (arguments.head)->type);
      if (pSVar3 == (SynFunctionArgument *)0x0) {
        pos = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report
                  (ctx,pos,"ERROR: argument name not found after \',\' in function argument list");
        break;
      }
      IntrusiveList<SynFunctionArgument>::push_back
                ((IntrusiveList<SynFunctionArgument> *)&ctx_local,pSVar3);
    }
  }
  IVar1.tail = arguments.head;
  IVar1.head = (SynFunctionArgument *)ctx_local;
  return IVar1;
}

Assistant:

IntrusiveList<SynFunctionArgument> ParseFunctionArguments(ParseContext &ctx)
{
	IntrusiveList<SynFunctionArgument> arguments;

	if(SynFunctionArgument *argument = ParseFunctionArgument(ctx, false, NULL))
	{
		arguments.push_back(argument);

		while(ctx.Consume(lex_comma))
		{
			argument = ParseFunctionArgument(ctx, arguments.tail->isExplicit, arguments.tail->type);

			if(!argument)
			{
				Report(ctx, ctx.Current(), "ERROR: argument name not found after ',' in function argument list");

				break;
			}

			arguments.push_back(argument);
		}
	}

	return arguments;
}